

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::DynamicMapField::InsertOrLookupMapValue
          (DynamicMapField *this,MapKey *map_key,MapValueRef *val)

{
  _Alloc_hider _Var1;
  int iVar2;
  Type TVar3;
  undefined4 extraout_var;
  MapValueRef *pMVar4;
  undefined4 extraout_var_00;
  FieldDescriptor *this_00;
  undefined4 extraout_var_01;
  long *plVar5;
  undefined8 *puVar6;
  int *piVar7;
  string local_50;
  
  iVar2 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x11])();
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
            ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
              *)&local_50,
             ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
             CONCAT44(extraout_var,iVar2))->elements_,map_key,(TreeIterator *)0x0);
  _Var1._M_p = local_50._M_dataplus._M_p;
  if (local_50._M_dataplus._M_p == (pointer)0x0) {
    pMVar4 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                       ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
                        CONCAT44(extraout_var,iVar2),map_key);
    iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x17])();
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"value","");
    this_00 = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var_00,iVar2),&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    TVar3 = FieldDescriptor::type(this_00);
    piVar7 = &pMVar4->type_;
    pMVar4->type_ = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4);
    TVar3 = FieldDescriptor::type(this_00);
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4)) {
    case 1:
    case 3:
    case 6:
    case 8:
      puVar6 = (undefined8 *)operator_new(4);
      *(undefined4 *)puVar6 = 0;
      break;
    case 2:
    case 4:
    case 5:
      puVar6 = (undefined8 *)operator_new(8);
      *puVar6 = 0;
      break;
    case 7:
      puVar6 = (undefined8 *)operator_new(1);
      *(undefined1 *)puVar6 = 0;
      break;
    case 9:
      puVar6 = (undefined8 *)operator_new(0x20);
      *puVar6 = puVar6 + 2;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      break;
    case 10:
      iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x16])();
      plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xd8))
                                 ((long *)CONCAT44(extraout_var_01,iVar2),this->default_entry_,
                                  this_00,0);
      puVar6 = (undefined8 *)(**(code **)(*plVar5 + 0x18))(plVar5);
      break;
    default:
      goto switchD_00324af2_default;
    }
    pMVar4->data_ = puVar6;
  }
  else {
    pMVar4 = (MapValueRef *)(*(long *)(local_50._M_dataplus._M_p + 0x10) + 0x10);
    piVar7 = (int *)(*(long *)(local_50._M_dataplus._M_p + 0x10) + 0x18);
  }
switchD_00324af2_default:
  val->type_ = *piVar7;
  val->data_ = pMVar4->data_;
  return _Var1._M_p == (pointer)0x0;
}

Assistant:

bool DynamicMapField::InsertOrLookupMapValue(
    const MapKey& map_key, MapValueRef* val) {
  // Always use mutable map because users may change the map value by
  // MapValueRef.
  Map<MapKey, MapValueRef>* map = MutableMap();
  Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
  if (iter == map->end()) {
    // Insert
    MapValueRef& map_val = (*map)[map_key];
    const FieldDescriptor* val_des =
        default_entry_->GetDescriptor()->FindFieldByName("value");
    map_val.SetType(val_des->cpp_type());
    // Allocate memory for the inserted MapValueRef, and initialize to
    // default value.
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                              \
      case google::protobuf::FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
        TYPE * value = new TYPE();                              \
        map_val.SetValue(value);                                \
        break;                                                  \
      }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = default_entry_->GetReflection()->GetMessage(
            *default_entry_, val_des);
        Message* value = message.New();
        map_val.SetValue(value);
        break;
      }
    }
    val->CopyFrom(map_val);
    return true;
  }
  // map_key is already in the map. Make sure (*map)[map_key] is not called.
  // [] may reorder the map and iterators.
  val->CopyFrom(iter->second);
  return false;
}